

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O3

sample_type __thiscall
charls::jls_codec<charls::lossless_traits<unsigned_short,_16>,_charls::decoder_strategy>::
decode_run_interruption_pixel
          (jls_codec<charls::lossless_traits<unsigned_short,_16>,_charls::decoder_strategy> *this,
          int32_t ra,int32_t rb)

{
  sample_type sVar1;
  short sVar2;
  int32_t iVar3;
  
  if (ra == rb) {
    iVar3 = decode_run_interruption_error(this,(this->context_run_mode_)._M_elems + 1);
    sVar1 = (short)iVar3 + (short)ra;
  }
  else {
    iVar3 = decode_run_interruption_error(this,(this->context_run_mode_)._M_elems);
    sVar2 = -(short)iVar3;
    if (ra <= rb) {
      sVar2 = (short)iVar3;
    }
    sVar1 = sVar2 + (short)rb;
  }
  return sVar1;
}

Assistant:

sample_type decode_run_interruption_pixel(int32_t ra, int32_t rb)
    {
        if (std::abs(ra - rb) <= traits_.near_lossless)
        {
            const int32_t error_value{decode_run_interruption_error(context_run_mode_[1])};
            return static_cast<sample_type>(traits_.compute_reconstructed_sample(ra, error_value));
        }

        const int32_t error_value{decode_run_interruption_error(context_run_mode_[0])};
        return static_cast<sample_type>(traits_.compute_reconstructed_sample(rb, error_value * sign(rb - ra)));
    }